

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O1

void png_read_filter_row_sub4_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  undefined4 uVar1;
  ulong uVar2;
  png_byte pVar3;
  png_byte pVar4;
  png_byte pVar5;
  png_byte pVar6;
  
  uVar2 = row_info->rowbytes + 4;
  if (4 < uVar2) {
    pVar3 = '\0';
    pVar4 = '\0';
    pVar5 = '\0';
    pVar6 = '\0';
    do {
      uVar1 = *(undefined4 *)row;
      pVar3 = pVar3 + (char)uVar1;
      pVar4 = pVar4 + (char)((uint)uVar1 >> 8);
      pVar5 = pVar5 + (char)((uint)uVar1 >> 0x10);
      pVar6 = pVar6 + (char)((uint)uVar1 >> 0x18);
      *row = pVar3;
      row[1] = pVar4;
      row[2] = pVar5;
      row[3] = pVar6;
      row = row + 4;
      uVar2 = uVar2 - 4;
    } while (4 < uVar2);
  }
  return;
}

Assistant:

void png_read_filter_row_sub4_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* The Sub filter predicts each pixel as the previous pixel, a.
    * There is no pixel to the left of the first pixel.  It's encoded directly.
    * That works with our main loop if we just say that left pixel was zero.
    */
   size_t rb;

   __m128i a, d = _mm_setzero_si128();

   png_debug(1, "in png_read_filter_row_sub4_sse2");

   rb = row_info->rowbytes+4;
   while (rb > 4) {
      a = d; d = load4(row);
      d = _mm_add_epi8(d, a);
      store4(row, d);

      row += 4;
      rb  -= 4;
   }
   PNG_UNUSED(prev)
}